

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O1

int speakers_within_set(int set,vbap_data *data)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  compute_set_matrix_3d(set,data);
  uVar2 = (ulong)data->speaker_count;
  bVar5 = uVar2 != 0;
  if (bVar5) {
    uVar3 = 0;
    do {
      if (((uVar3 != data->sets[set].speakers[0]) && (uVar3 != data->sets[set].speakers[1])) &&
         (uVar3 != data->sets[set].speakers[2])) {
        bVar1 = true;
        lVar4 = 0;
        do {
          if (*(float *)((long)data->sets[set].inv_mat + lVar4 + 8) * data->speakers[uVar3][2] +
              *(float *)((long)data->sets[set].inv_mat + lVar4) * data->speakers[uVar3][0] +
              *(float *)((long)data->sets[set].inv_mat + lVar4 + 4) * data->speakers[uVar3][1] <
              -0.001) {
            bVar1 = false;
          }
          lVar4 = lVar4 + 0xc;
        } while (lVar4 != 0x24);
        if (bVar1) break;
      }
      uVar3 = uVar3 + 1;
      bVar5 = uVar3 < uVar2;
    } while (uVar3 != uVar2);
  }
  return (uint)bVar5;
}

Assistant:

int speakers_within_set(int set, struct vbap_data *data){
  compute_set_matrix_3d(set, data);
  float *inv_mat = data->sets[set].inv_mat;
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  int k = data->sets[set].speakers[2];
  for(int s=0; s<data->speaker_count; ++s){
    if(s != i && s != j && s != k){
      float *sp = data->speakers[s];
      char inside = 1;
      for(int t=0; t<3; ++t){
        float tmp = sp[0] * inv_mat[0 + t*3] +
                    sp[1] * inv_mat[1 + t*3] +
                    sp[2] * inv_mat[2 + t*3];
        if(tmp < -0.001) inside = 0;
      }
      if(inside) return 1;
    }
  }
  return 0;
}